

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes_abi_cxx11_
          (string *__return_storage_ptr__,XmlUnitTestResultPrinter *this,TestResult *result)

{
  TestProperty *pTVar1;
  Message *pMVar2;
  int i;
  allocator local_89;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  string *local_80;
  pointer local_78;
  string local_70;
  string local_50;
  
  local_80 = __return_storage_ptr__;
  Message::Message((Message *)&local_88);
  for (i = 0; i < (int)((ulong)((long)this[2].output_file_._M_dataplus._M_p -
                               (long)this[2].super_EmptyTestEventListener.super_TestEventListener.
                                     _vptr_TestEventListener) >> 6); i = i + 1) {
    pTVar1 = TestResult::GetTestProperty((TestResult *)this,i);
    std::operator<<((ostream *)(local_88._M_head_impl + 0x10)," ");
    local_78 = (pTVar1->key_)._M_dataplus._M_p;
    pMVar2 = Message::operator<<((Message *)&local_88,&local_78);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x141fa3);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x140f0d);
    std::__cxx11::string::string((string *)&local_70,(pTVar1->value_)._M_dataplus._M_p,&local_89);
    EscapeXmlAttribute(&local_50,&local_70);
    pMVar2 = Message::operator<<(pMVar2,&local_50);
    Message::operator<<(pMVar2,(char (*) [2])0x140f0d);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  StringStreamToString(local_80,local_88._M_head_impl);
  if (local_88._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_88._M_head_impl + 8))();
  }
  return local_80;
}

Assistant:

std::string XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes(
    const TestResult& result) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << " " << property.key() << "="
        << "\"" << EscapeXmlAttribute(property.value()) << "\"";
  }
  return attributes.GetString();
}